

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::PopColumnsBackground(void)

{
  ImGuiWindow *clip_rect;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  
  clip_rect = GetCurrentWindowRead();
  if (((clip_rect->DC).CurrentColumns)->Count != 1) {
    SetWindowClipRectBeforeSetChannel
              ((ImGuiWindow *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(ImRect *)clip_rect);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)window,(ImDrawList *)columns,unaff_retaddr_00);
  }
  return;
}

Assistant:

void ImGui::PopColumnsBackground()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns->Count == 1)
        return;

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, columns->HostBackupClipRect);
    columns->Splitter.SetCurrentChannel(window->DrawList, columns->Current + 1);
}